

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode h2_progress_egress(Curl_cfilter *cf,Curl_easy *data)

{
  bufq *q;
  byte *pbVar1;
  undefined8 *puVar2;
  HTTP *pHVar3;
  uint *puVar4;
  void *pvVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ssize_t sVar10;
  size_t sVar11;
  int iVar12;
  CURLcode CVar13;
  ulong uVar14;
  nghttp2_priority_spec pri_spec;
  
  puVar2 = (undefined8 *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (pHVar3 = (data->req).p.http, pHVar3 != (HTTP *)0x0)) &&
      (puVar4 = (uint *)pHVar3->h2_ctx, puVar4 != (uint *)0x0)) && (0 < (int)*puVar4)) {
    iVar8 = (data->set).priority.weight;
    if (iVar8 == 0) {
      iVar8 = 0x10;
    }
    iVar12 = (data->state).priority.weight;
    if (iVar12 == 0) {
      iVar12 = 0x10;
    }
    if (((iVar8 != iVar12) ||
        ((((data->state).priority.field_0x14 ^ (data->set).priority.field_0x14) & 1) != 0)) ||
       ((data->set).priority.parent != (data->state).priority.parent)) {
      h2_pri_spec(data,&pri_spec);
      if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] Queuing PRIORITY",(ulong)*puVar4);
      }
      uVar7 = nghttp2_submit_priority((nghttp2_session *)*puVar2,'\0',*puVar4,&pri_spec);
      uVar14 = (ulong)uVar7;
      if (uVar7 != 0) goto LAB_00573c7f;
    }
  }
  *(byte *)(puVar2 + 0x19) = *(byte *)(puVar2 + 0x19) & 0xf7;
  uVar14 = 0;
  while ((((int)uVar14 == 0 && (uVar14 = 0, (*(byte *)(puVar2 + 0x19) & 8) == 0)) &&
         (iVar8 = nghttp2_session_want_write((nghttp2_session *)*puVar2), iVar8 != 0))) {
    uVar7 = nghttp2_session_send((nghttp2_session *)*puVar2);
    uVar14 = (ulong)uVar7;
  }
LAB_00573c7f:
  iVar8 = nghttp2_is_fatal((int)uVar14);
  if (iVar8 == 0) {
    pvVar5 = cf->ctx;
    q = (bufq *)((long)pvVar5 + 0x58);
    _Var6 = Curl_bufq_is_empty(q);
    CVar13 = CURLE_OK;
    if (!_Var6) {
      sVar10 = Curl_bufq_pass(q,nw_out_writer,cf,(CURLcode *)&pri_spec);
      if (sVar10 < 0) {
        CVar13 = pri_spec.stream_id;
        if (pri_spec.stream_id == 0x51) {
          CVar13 = CURLE_AGAIN;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
             (0 < cf->cft->log_level)) {
            sVar11 = Curl_bufq_len(q);
            Curl_trc_cf_infof(data,cf,"flush nw send buffer(%zu) -> EAGAIN",sVar11);
            CVar13 = pri_spec.stream_id;
          }
          pbVar1 = (byte *)((long)pvVar5 + 200);
          *pbVar1 = *pbVar1 | 8;
        }
      }
      else {
        _Var6 = Curl_bufq_is_empty(q);
        CVar13 = CURLE_AGAIN;
        if (_Var6) {
          CVar13 = CURLE_OK;
        }
      }
    }
  }
  else {
    CVar13 = CURLE_SEND_ERROR;
    if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
       (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
      pcVar9 = nghttp2_strerror((int)uVar14);
      Curl_trc_cf_infof(data,cf,"nghttp2_session_send error (%s)%d",pcVar9,uVar14);
    }
  }
  return CVar13;
}

Assistant:

static CURLcode h2_progress_egress(struct Curl_cfilter *cf,
                                  struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  int rv = 0;

  if(stream && stream->id > 0 &&
     ((sweight_wanted(data) != sweight_in_effect(data)) ||
      (data->set.priority.exclusive != data->state.priority.exclusive) ||
      (data->set.priority.parent != data->state.priority.parent)) ) {
    /* send new weight and/or dependency */
    nghttp2_priority_spec pri_spec;

    h2_pri_spec(data, &pri_spec);
    CURL_TRC_CF(data, cf, "[%d] Queuing PRIORITY", stream->id);
    DEBUGASSERT(stream->id != -1);
    rv = nghttp2_submit_priority(ctx->h2, NGHTTP2_FLAG_NONE,
                                 stream->id, &pri_spec);
    if(rv)
      goto out;
  }

  ctx->nw_out_blocked = 0;
  while(!rv && !ctx->nw_out_blocked && nghttp2_session_want_write(ctx->h2))
    rv = nghttp2_session_send(ctx->h2);

out:
  if(nghttp2_is_fatal(rv)) {
    CURL_TRC_CF(data, cf, "nghttp2_session_send error (%s)%d",
                nghttp2_strerror(rv), rv);
    return CURLE_SEND_ERROR;
  }
  return nw_out_flush(cf, data);
}